

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O0

int __thiscall ncnn::ReLU::forward_inplace(ReLU *this,Mat *bottom_top_blob)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  int i_1;
  float *ptr_1;
  int q_1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  undefined8 in_stack_ffffffffffffff20;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff28;
  int local_b4;
  Mat local_b0;
  Mat *local_80;
  int local_74;
  int local_70;
  Mat local_60;
  float *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = *(int *)(in_RSI + 0x1c);
  local_18 = *(int *)(in_RSI + 0x20);
  local_1c = *(int *)(in_RSI + 0x24);
  local_20 = local_14 * local_18;
  if ((*(float *)(in_RDI + 0x80) != 0.0) || (NAN(*(float *)(in_RDI + 0x80)))) {
    for (local_74 = 0; local_74 < local_1c; local_74 = local_74 + 1) {
      this_00 = &local_b0;
      Mat::channel(in_stack_ffffffffffffff28,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffff28 = (Mat *)Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x128f05);
      for (local_b4 = 0; local_b4 < local_20; local_b4 = local_b4 + 1) {
        pfVar1 = (float *)((long)&in_stack_ffffffffffffff28->data + (long)local_b4 * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(float *)((long)&in_stack_ffffffffffffff28->data + (long)local_b4 * 4) =
               *(float *)(in_RDI + 0x80) *
               *(float *)((long)&in_stack_ffffffffffffff28->data + (long)local_b4 * 4);
        }
      }
      local_80 = in_stack_ffffffffffffff28;
    }
  }
  else {
    for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
      Mat::channel(in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      pfVar1 = Mat::operator_cast_to_float_(&local_60);
      Mat::~Mat((Mat *)0x128e18);
      for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
        if (pfVar1[local_70] <= 0.0 && pfVar1[local_70] != 0.0) {
          pfVar1[local_70] = 0.0;
        }
      }
      local_30 = pfVar1;
    }
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace(Mat& bottom_top_blob) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (slope == 0.f)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}